

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O2

bool jsoncons::bson::detail::dec128_istreq(char *a,char *lasta,char *b,char *lastb)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  
  while( true ) {
    bVar3 = b == lastb;
    bVar4 = a == lasta;
    if ((bVar4) || (b == lastb)) goto LAB_0019e280;
    cVar1 = dec128_tolower(*a);
    cVar2 = dec128_tolower(*b);
    if (cVar1 != cVar2) break;
    a = a + 1;
    b = b + 1;
  }
  bVar4 = false;
  bVar3 = false;
LAB_0019e280:
  return (bool)(bVar4 & bVar3);
}

Assistant:

inline
        bool dec128_istreq (const char* a, const char* lasta,
                            const char* b, const char* lastb)
        {
            while (!(a == lasta && b == lastb)) 
            {
               // strings are different lengths
               if (a == lasta || b == lastb) 
               {
                  return false;
               }
         
               if (dec128_tolower (*a) != dec128_tolower (*b)) {
                  return false;
               }
         
               a++;
               b++;
            }
         
            return true;
        }